

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O3

int SetMotorRelativeIM483I(IM483I *pIM483I,int val,BOOL bForce)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  ulong uVar6;
  char *__s;
  uint uVar7;
  int writebuflen;
  char recvbuf [512];
  char sendbuf [512];
  timespec local_438 [32];
  uint8 local_238 [520];
  
  uVar7 = 0x7fffff;
  if (val < 0x7fffff) {
    uVar7 = val;
  }
  uVar6 = 0xff800001;
  if (-0x7fffff < (int)uVar7) {
    uVar6 = (ulong)uVar7;
  }
  if (bForce == 0) {
    uVar2 = (int)uVar6 - pIM483I->LastRval;
    uVar7 = -uVar2;
    if (0 < (int)uVar2) {
      uVar7 = uVar2;
    }
    uVar2 = pIM483I->ThresholdRval;
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    if (uVar7 < uVar1) {
      return 0;
    }
  }
  memset(local_238,0,0x200);
  sprintf((char *)local_238,"R%d\r",uVar6);
  sVar4 = strlen((char *)local_238);
  writebuflen = (int)sVar4;
  iVar3 = WriteDataIM483I(pIM483I,local_238,writebuflen,pIM483I->bytedelayus);
  if (iVar3 == 0) {
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_238,(long)writebuflen,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    local_438[0].tv_sec = 0;
    local_438[0].tv_nsec = 20000000;
    nanosleep(local_438,(timespec *)0x0);
    if (pIM483I->bCheckState != 0) {
      memset(local_438,0,0x200);
      uVar7 = writebuflen + 1;
      iVar3 = (pIM483I->RS232Port).DevType;
      if (iVar3 - 1U < 4) {
        if (-1 < writebuflen) {
          iVar3 = (pIM483I->RS232Port).s;
          uVar2 = 0;
          do {
            sVar5 = recv(iVar3,(void *)((long)&local_438[0].tv_sec + (ulong)uVar2),
                         (long)(int)(uVar7 - uVar2),0);
            if ((int)sVar5 < 1) goto LAB_0011a71a;
            uVar2 = uVar2 + (int)sVar5;
          } while ((int)uVar2 <= writebuflen);
        }
      }
      else {
        if (iVar3 != 0) {
LAB_0011a71a:
          __s = "Error reading data from a IM483I. ";
          goto LAB_0011a590;
        }
        if (uVar7 != 0) {
          iVar3 = *(int *)&(pIM483I->RS232Port).hDev;
          uVar2 = 0;
          do {
            sVar5 = read(iVar3,(void *)((long)&local_438[0].tv_sec + (ulong)uVar2),
                         (ulong)(uVar7 - uVar2));
            if ((int)sVar5 < 1) goto LAB_0011a71a;
            uVar2 = uVar2 + (int)sVar5;
          } while (uVar2 < uVar7);
        }
      }
      if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
        fwrite(local_438,(long)(int)uVar7,1,(FILE *)pIM483I->pfSaveFile);
        fflush((FILE *)pIM483I->pfSaveFile);
      }
      iVar3 = strncmp((char *)local_438,(char *)local_238,(long)writebuflen);
      if ((iVar3 != 0) || (*(char *)((long)&local_438[0].tv_sec + (long)writebuflen) != '\n')) {
        puts("Error reading data from a IM483I : Invalid data. ");
        return 4;
      }
    }
    iVar3 = 0;
    pIM483I->LastRval = (int)uVar6;
  }
  else {
    __s = "Error writing data to a IM483I. ";
LAB_0011a590:
    puts(__s);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

inline int SetMotorRelativeIM483I(IM483I* pIM483I, int val, BOOL bForce)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	val = max(min(val, (int)MAX_INDEX_IM483I), -(int)MAX_INDEX_IM483I);

	// The requested value is only applied if it is slightly different from the current value.
	if ((!bForce)&&(abs(val-pIM483I->LastRval) < abs(pIM483I->ThresholdRval))) return EXIT_SUCCESS;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "R%d\r", val);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(20);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	// Update last known value.
	pIM483I->LastRval = val;

	return EXIT_SUCCESS;
}